

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_flattener.h
# Opt level: O2

LinTerms * mp::ToLinTerms(LinTerms *__return_storage_ptr__,LinearExpr *e)

{
  ptr pTVar1;
  ptr pTVar2;
  
  (__return_storage_ptr__->coefs_).super_small_vector_base<std::allocator<double>,_6U>.m_data.
  super_small_vector_data_base<double_*,_unsigned_long>.m_capacity = 6;
  (__return_storage_ptr__->coefs_).super_small_vector_base<std::allocator<double>,_6U>.m_data.
  super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
       (ptr)&(__return_storage_ptr__->coefs_).super_small_vector_base<std::allocator<double>,_6U>.
             m_data.m_storage;
  (__return_storage_ptr__->coefs_).super_small_vector_base<std::allocator<double>,_6U>.m_data.
  super_small_vector_data_base<double_*,_unsigned_long>.m_size = 0;
  (__return_storage_ptr__->vars_).super_small_vector_base<std::allocator<int>,_6U>.m_data.
  super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
  (__return_storage_ptr__->vars_).super_small_vector_base<std::allocator<int>,_6U>.m_data.
  super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
       (ptr)&(__return_storage_ptr__->vars_).super_small_vector_base<std::allocator<int>,_6U>.m_data
             .m_storage;
  (__return_storage_ptr__->vars_).super_small_vector_base<std::allocator<int>,_6U>.m_data.
  super_small_vector_data_base<int_*,_unsigned_long>.m_size = 0;
  LinTerms::reserve(__return_storage_ptr__,
                    (long)(int)(e->terms_).
                               super_small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>.
                               m_data.
                               super_small_vector_data_base<mp::LinearExpr::Term_*,_unsigned_long>.
                               m_size);
  pTVar1 = (e->terms_).super_small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>.m_data.
           super_small_vector_data_base<mp::LinearExpr::Term_*,_unsigned_long>.m_data_ptr;
  for (pTVar2 = pTVar1;
      pTVar2 != pTVar1 + (e->terms_).
                         super_small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>.m_data.
                         super_small_vector_data_base<mp::LinearExpr::Term_*,_unsigned_long>.m_size;
      pTVar2 = pTVar2 + 1) {
    LinTerms::add_term(__return_storage_ptr__,pTVar2->coef_,pTVar2->var_index_);
    pTVar1 = (e->terms_).super_small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>.m_data.
             super_small_vector_data_base<mp::LinearExpr::Term_*,_unsigned_long>.m_data_ptr;
  }
  return __return_storage_ptr__;
}

Assistant:

inline
LinTerms ToLinTerms(const LinearExpr& e) {
  LinTerms le;
  le.reserve(e.num_terms());
  for (auto it=e.begin(); it!=e.end(); ++it) {
    le.add_term(it->coef(), it->var_index());
  }
  return le;
}